

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  long lVar7;
  char cVar8;
  uint uVar9;
  buffer_appender<char> bVar10;
  ulong uVar11;
  ulong uVar12;
  buffer<char> *buf;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [8];
  undefined1 auVar16 [8];
  char *pcVar17;
  int iVar18;
  _Alloc_hider _Var19;
  uint uVar20;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_2b0;
  char acStack_98 [8];
  char digits [40];
  undefined1 local_60 [8];
  string groups;
  
  grouping_impl<char>((string *)local_60,(locale_ref)(this->locale).locale_);
  if (groups._M_dataplus._M_p == (pointer)0x0) {
    on_dec(this);
  }
  else {
    cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar8 != '\0') {
      uVar11 = this->abs_value;
      lVar7 = 0x3f;
      if ((uVar11 | 1) != 0) {
        for (; (uVar11 | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar4 = *(ushort *)(basic_data<void>::bsr2log10 + (uint)((int)lVar7 * 2));
      uVar23 = (uint)uVar4 -
               (uint)(uVar11 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                         (ulong)uVar4 * 8));
      iVar22 = -(uint)(uVar11 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                          (ulong)uVar4 * 8));
      pcVar17 = (char *)((long)local_60 + (long)groups._M_dataplus._M_p);
      auVar15 = local_60;
      uVar14 = uVar23;
      uVar9 = uVar23;
      if (groups._M_dataplus._M_p != (pointer)0x0) {
        auVar16 = local_60;
        _Var19 = groups._M_dataplus;
        uVar13 = uVar23;
        do {
          cVar2 = *(char *)auVar16;
          uVar20 = uVar9 - (int)cVar2;
          auVar15 = auVar16;
          uVar14 = uVar13;
          if ((uVar20 == 0 || (int)uVar9 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar13 = uVar13 + 1;
          auVar16 = (undefined1  [8])((long)auVar16 + 1);
          _Var19._M_p = _Var19._M_p + -1;
          auVar15 = (undefined1  [8])pcVar17;
          uVar14 = (int)groups._M_dataplus._M_p + iVar22 + (uint)uVar4;
          uVar9 = uVar20;
        } while (_Var19._M_p != (pointer)0x0);
      }
      if (auVar15 == (undefined1  [8])pcVar17) {
        uVar14 = uVar14 + (int)(uVar9 - 1) / (int)pcVar17[-1];
      }
      pcVar17 = acStack_98 + (int)uVar23;
      uVar12 = uVar11;
      if (99 < uVar11) {
        do {
          uVar12 = uVar11 / 100;
          *(undefined2 *)(pcVar17 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar11 % 100) * 2);
          pcVar17 = pcVar17 + -2;
          bVar6 = 9999 < uVar11;
          uVar11 = uVar12;
        } while (bVar6);
      }
      if (uVar12 < 10) {
        pcVar17[-1] = (byte)uVar12 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar17 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar12 * 2);
      }
      local_2b0.super_buffer<char>.ptr_ = local_2b0.store_;
      local_2b0.super_buffer<char>.size_ = 0;
      groups.field_2._8_8_ = &PTR_grow_002c3bc0;
      local_2b0.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_002c3bc0;
      local_2b0.super_buffer<char>.capacity_ = 500;
      uVar14 = uVar14 + this->prefix_size;
      if (-1 < (int)uVar14) {
        uVar11 = (ulong)uVar14;
        if (500 < uVar14) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_2b0,uVar11);
        }
        pcVar17 = local_2b0.super_buffer<char>.ptr_;
        local_2b0.super_buffer<char>.size_ = local_2b0.super_buffer<char>.capacity_;
        if (uVar11 <= local_2b0.super_buffer<char>.capacity_) {
          local_2b0.super_buffer<char>.size_ = uVar11;
        }
        pcVar21 = local_2b0.super_buffer<char>.ptr_ + uVar11;
        if (0 < (int)uVar23) {
          uVar12 = (ulong)uVar23;
          iVar18 = iVar22 + (uint)uVar4 + 1;
          iVar22 = 0;
          auVar15 = local_60;
          do {
            uVar12 = uVar12 - 1;
            pcVar1 = pcVar21 + -1;
            pcVar21[-1] = acStack_98[uVar12 & 0xffffffff];
            cVar2 = *(char *)auVar15;
            if ('\0' < cVar2) {
              iVar22 = iVar22 + 1;
              if ((cVar2 != '\x7f') && (iVar22 % (int)cVar2 == 0)) {
                if ((char *)((long)auVar15 + 1) !=
                    (char *)((long)local_60 + (long)groups._M_dataplus._M_p)) {
                  iVar22 = 0;
                  auVar15 = (undefined1  [8])((long)auVar15 + 1);
                }
                pcVar21[-2] = cVar8;
                pcVar1 = pcVar21 + -2;
              }
            }
            pcVar21 = pcVar1;
            iVar18 = iVar18 + -1;
          } while (1 < iVar18);
        }
        if (this->prefix_size != 0) {
          pcVar21[-1] = 0x2d;
        }
        pbVar5 = this->specs;
        uVar12 = (ulong)pbVar5->width;
        if (-1 < (long)uVar12) {
          uVar24 = 0;
          if (uVar11 <= uVar12) {
            uVar24 = uVar12 - uVar11;
          }
          bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + uVar11 + (pbVar5->fill).size_ * uVar24) {
            (*(code *)**(undefined8 **)
                        bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar12 = uVar24 >> (bVar3 & 0x3f);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar12,&pbVar5->fill);
          bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (pcVar17,pcVar17 + uVar11,bVar10);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar10,uVar24 - uVar12,&pbVar5->fill);
          (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          local_2b0.super_buffer<char>._vptr_buffer = (_func_int **)groups.field_2._8_8_;
          if (local_2b0.super_buffer<char>.ptr_ != local_2b0.store_) {
            operator_delete(local_2b0.super_buffer<char>.ptr_,local_2b0.super_buffer<char>.capacity_
                           );
          }
          goto LAB_0023f9ea;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                  ,0x13c,"negative value");
    }
    on_dec(this);
  }
LAB_0023f9ea:
  if (local_60 != (undefined1  [8])&groups._M_string_length) {
    operator_delete((void *)local_60,groups._M_string_length + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(to_unsigned(size));
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    using iterator = remove_reference_t<decltype(reserve(out, 0))>;
    auto data = buffer.data();
    out = write_padded<align::right>(out, specs, size, size, [=](iterator it) {
      return copy_str<Char>(data, data + size, it);
    });
  }